

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdf_legacy_kmgmt.c
# Opt level: O0

KDF_DATA * ossl_kdf_data_new(void *provctx)

{
  int iVar1;
  CRYPTO_RWLOCK *pCVar2;
  OSSL_LIB_CTX *pOVar3;
  PROV_CTX *in_RDI;
  KDF_DATA *kdfdata;
  char *in_stack_fffffffffffffff8;
  KDF_DATA *ptr;
  
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    ptr = (KDF_DATA *)0x0;
  }
  else {
    ptr = (KDF_DATA *)
          CRYPTO_zalloc((size_t)kdfdata,in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20));
    if (ptr == (KDF_DATA *)0x0) {
      ptr = (KDF_DATA *)0x0;
    }
    else {
      pCVar2 = CRYPTO_THREAD_lock_new();
      ptr->lock = pCVar2;
      if (ptr->lock == (CRYPTO_RWLOCK *)0x0) {
        CRYPTO_free(ptr);
        ptr = (KDF_DATA *)0x0;
      }
      else {
        pOVar3 = ossl_prov_ctx_get0_libctx(in_RDI);
        ptr->libctx = pOVar3;
        LOCK();
        ptr->refcnt = 1;
        UNLOCK();
      }
    }
  }
  return ptr;
}

Assistant:

KDF_DATA *ossl_kdf_data_new(void *provctx)
{
    KDF_DATA *kdfdata;

    if (!ossl_prov_is_running())
        return NULL;

    kdfdata = OPENSSL_zalloc(sizeof(*kdfdata));
    if (kdfdata == NULL)
        return NULL;

    kdfdata->lock = CRYPTO_THREAD_lock_new();
    if (kdfdata->lock == NULL) {
        OPENSSL_free(kdfdata);
        return NULL;
    }
    kdfdata->libctx = PROV_LIBCTX_OF(provctx);
    kdfdata->refcnt = 1;

    return kdfdata;
}